

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleList::child(QAccessibleList *this,int logicalIndex)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  QModelIndex *index_;
  QAbstractItemModel *pQVar4;
  uint *puVar5;
  uint in_ESI;
  QAccessibleTable *in_RDI;
  long in_FS_OFFSET;
  QAccessibleTableCell *iface;
  int column;
  int row;
  QListView *listView;
  QAbstractItemModel *theModel;
  QAbstractItemView *theView;
  QModelIndex index;
  QModelIndex rootIndex;
  const_iterator id;
  int *in_stack_ffffffffffffff08;
  QModelIndex *in_stack_ffffffffffffff10;
  const_iterator *in_stack_ffffffffffffff18;
  QAccessibleTableCell *in_stack_ffffffffffffff20;
  QAccessibleInterface *local_90;
  char local_80 [32];
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  piter local_30;
  piter local_20;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  index_ = (QModelIndex *)QAccessibleTable::view((QAccessibleTable *)0x7f8317);
  if (index_ == (QModelIndex *)0x0) {
    local_90 = (QAccessibleInterface *)0x0;
  }
  else {
    pQVar4 = QAbstractItemView::model((QAbstractItemView *)in_stack_ffffffffffffff20);
    if (pQVar4 == (QAbstractItemModel *)0x0) {
      local_90 = (QAccessibleInterface *)0x0;
    }
    else {
      iVar2 = (**(code **)(*(long *)in_RDI + 0x58))();
      if (iVar2 == 0) {
        local_90 = (QAccessibleInterface *)0x0;
      }
      else {
        local_20.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_20.d = (Data<QHashPrivate::Node<int,_unsigned_int>_> *)&DAT_aaaaaaaaaaaaaaaa;
        local_20 = (piter)QHash<int,_unsigned_int>::constFind
                                    ((QHash<int,_unsigned_int> *)in_stack_ffffffffffffff10,
                                     in_stack_ffffffffffffff08);
        local_30 = (piter)QHash<int,_unsigned_int>::constEnd
                                    ((QHash<int,_unsigned_int> *)in_stack_ffffffffffffff18);
        bVar1 = QHash<int,_unsigned_int>::const_iterator::operator!=
                          (in_stack_ffffffffffffff18,(const_iterator *)in_stack_ffffffffffffff10);
        if (bVar1) {
          puVar5 = QHash<int,_unsigned_int>::const_iterator::value((const_iterator *)0x7f83ff);
          local_90 = (QAccessibleInterface *)QAccessible::accessibleInterface(*puVar5);
        }
        else {
          qobject_cast<QListView_const*>((QObject *)0x7f841a);
          uVar3 = QListView::modelColumn((QListView *)in_stack_ffffffffffffff10);
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          local_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_38 = &DAT_aaaaaaaaaaaaaaaa;
          QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_ffffffffffffff10);
          local_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          local_50 = &DAT_aaaaaaaaaaaaaaaa;
          (**(code **)(*(long *)pQVar4 + 0x60))(&local_60,pQVar4,local_c,uVar3,&local_48);
          bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff10);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_90 = (QAccessibleInterface *)operator_new(0x38);
            QAccessibleTable::cellRole(in_RDI);
            QAccessibleTableCell::QAccessibleTableCell
                      (in_stack_ffffffffffffff20,(QAbstractItemView *)local_90,index_,
                       (Role)((ulong)in_stack_ffffffffffffff08 >> 0x20));
            QAccessible::registerAccessibleInterface((QAccessibleInterface *)local_90);
            QAccessible::uniqueId((QAccessibleInterface *)local_90);
            QHash<int,_unsigned_int>::insert
                      ((QHash<int,_unsigned_int> *)index_,in_stack_ffffffffffffff08,(uint *)0x7f859f
                      );
          }
          else {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18
                       ,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                       (char *)in_stack_ffffffffffffff08);
            QMessageLogger::warning
                      (local_80,"QAccessibleList::child: Invalid index at: %d %d",(ulong)local_c,
                       (ulong)uVar3);
            local_90 = (QAccessibleInterface *)0x0;
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_90;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleList::child(int logicalIndex) const
{
    QAbstractItemView *theView = view();
    if (!theView)
        return nullptr;
    const QAbstractItemModel *theModel = theView->model();
    if (!theModel)
        return nullptr;

    if (columnCount() == 0) {
        return nullptr;
    }

    const auto id = childToId.constFind(logicalIndex);
    if (id != childToId.constEnd())
        return QAccessible::accessibleInterface(id.value());

    const QListView *listView = qobject_cast<const QListView*>(theView);
    Q_ASSERT(listView);
    int row = logicalIndex;
    int column = listView->modelColumn();

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = theModel->index(row, column, rootIndex);
    if (Q_UNLIKELY(!index.isValid())) {
        qWarning("QAccessibleList::child: Invalid index at: %d %d", row, column);
        return nullptr;
    }
    const auto iface = new QAccessibleTableCell(theView, index, cellRole());

    QAccessible::registerAccessibleInterface(iface);
    childToId.insert(logicalIndex, QAccessible::uniqueId(iface));
    return iface;
}